

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient> __thiscall
kj::
heap<kj::(anonymous_namespace)::NetworkAddressHttpClient,kj::Timer&,kj::HttpHeaderTable&,kj::Own<kj::NetworkAddress>,kj::HttpClientSettings&>
          (kj *this,Timer *params,HttpHeaderTable *params_1,Own<kj::NetworkAddress> *params_2,
          HttpClientSettings *params_3)

{
  NetworkAddressHttpClient *this_00;
  Timer *timer;
  HttpHeaderTable *responseHeaderTable;
  Own<kj::NetworkAddress> *other;
  HttpClientSettings *pHVar1;
  NetworkAddressHttpClient *extraout_RDX;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient> OVar2;
  Own<kj::NetworkAddress> local_40;
  HttpClientSettings *local_30;
  HttpClientSettings *params_local_3;
  Own<kj::NetworkAddress> *params_local_2;
  HttpHeaderTable *params_local_1;
  Timer *params_local;
  
  local_30 = params_3;
  params_local_3 = (HttpClientSettings *)params_2;
  params_local_2 = (Own<kj::NetworkAddress> *)params_1;
  params_local_1 = (HttpHeaderTable *)params;
  params_local = (Timer *)this;
  this_00 = (NetworkAddressHttpClient *)operator_new(0xb0);
  timer = fwd<kj::Timer&>((Timer *)params_local_1);
  responseHeaderTable = fwd<kj::HttpHeaderTable&>((HttpHeaderTable *)params_local_2);
  other = fwd<kj::Own<kj::NetworkAddress>>((NoInfer<kj::Own<kj::NetworkAddress>_> *)params_local_3);
  Own<kj::NetworkAddress>::Own(&local_40,other);
  pHVar1 = fwd<kj::HttpClientSettings&>(local_30);
  anon_unknown_31::NetworkAddressHttpClient::NetworkAddressHttpClient
            (this_00,timer,responseHeaderTable,&local_40,*pHVar1);
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>::Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient> *)this,this_00,
             (Disposer *)
             &_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::instance);
  Own<kj::NetworkAddress>::~Own(&local_40);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}